

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMParentNode.cpp
# Opt level: O1

DOMNode * __thiscall
xercesc_4_0::DOMParentNode::appendChildFast(DOMParentNode *this,DOMNode *newChild)

{
  DOMNode *pDVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  DOMException *this_00;
  undefined8 *puVar5;
  
  pDVar1 = this->fContainingNode;
  if (newChild == (DOMNode *)0x0) {
    plVar2 = (long *)0x0;
  }
  else {
    plVar2 = (long *)__dynamic_cast(newChild,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo,
                                    0xfffffffffffffffe);
  }
  if (plVar2 != (long *)0x0) {
    lVar3 = (**(code **)(*plVar2 + 0x10))(plVar2);
    if (lVar3 != 0) {
      lVar3 = (**(code **)(*plVar2 + 0x10))(plVar2);
      *(DOMNode **)(lVar3 + 8) = pDVar1;
      if (newChild == (DOMNode *)0x0) {
        plVar2 = (long *)0x0;
      }
      else {
        plVar2 = (long *)__dynamic_cast(newChild,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo,
                                        0xfffffffffffffffe);
      }
      if (plVar2 != (long *)0x0) {
        lVar3 = (**(code **)(*plVar2 + 0x10))(plVar2);
        if (lVar3 != 0) {
          lVar3 = (**(code **)(*plVar2 + 0x10))(plVar2);
          *(ushort *)(lVar3 + 0x10) = *(ushort *)(lVar3 + 0x10) | 8;
          if (this->fFirstChild == (DOMNode *)0x0) {
            this->fFirstChild = newChild;
            if (newChild == (DOMNode *)0x0) {
              plVar2 = (long *)0x0;
            }
            else {
              plVar2 = (long *)__dynamic_cast(newChild,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo,
                                              0xfffffffffffffffe);
            }
            if (plVar2 != (long *)0x0) {
              lVar3 = (**(code **)(*plVar2 + 0x10))(plVar2);
              if (lVar3 != 0) {
                lVar3 = (**(code **)(*plVar2 + 0x10))(plVar2);
                *(ushort *)(lVar3 + 0x10) = *(ushort *)(lVar3 + 0x10) | 0x10;
                if (newChild == (DOMNode *)0x0) {
                  plVar2 = (long *)0x0;
                }
                else {
                  plVar2 = (long *)__dynamic_cast(newChild,&DOMNode::typeinfo,
                                                  &HasDOMChildImpl::typeinfo,0xfffffffffffffffe);
                }
                if (plVar2 != (long *)0x0) {
                  lVar3 = (**(code **)(*plVar2 + 0x10))(plVar2);
                  if (lVar3 != 0) {
LAB_002809ad:
                    puVar5 = (undefined8 *)(**(code **)(*plVar2 + 0x10))(plVar2);
                    *puVar5 = newChild;
                    return newChild;
                  }
                }
                this_00 = (DOMException *)__cxa_allocate_exception(0x28);
                DOMException::DOMException(this_00,0xb,0,XMLPlatformUtils::fgMemoryManager);
                goto LAB_00280ae7;
              }
            }
            this_00 = (DOMException *)__cxa_allocate_exception(0x28);
            DOMException::DOMException(this_00,0xb,0,XMLPlatformUtils::fgMemoryManager);
          }
          else {
            plVar2 = (long *)__dynamic_cast(this->fFirstChild,&DOMNode::typeinfo,
                                            &HasDOMChildImpl::typeinfo,0xfffffffffffffffe);
            if (plVar2 != (long *)0x0) {
              lVar3 = (**(code **)(*plVar2 + 0x10))(plVar2);
              if (lVar3 != 0) {
                plVar2 = (long *)(**(code **)(*plVar2 + 0x10))(plVar2);
                lVar3 = *plVar2;
                if (lVar3 == 0) {
                  plVar2 = (long *)0x0;
                }
                else {
                  plVar2 = (long *)__dynamic_cast(lVar3,&DOMNode::typeinfo,
                                                  &HasDOMChildImpl::typeinfo,0xfffffffffffffffe);
                }
                if (plVar2 != (long *)0x0) {
                  lVar4 = (**(code **)(*plVar2 + 0x10))(plVar2);
                  if (lVar4 != 0) {
                    lVar4 = (**(code **)(*plVar2 + 0x10))(plVar2);
                    *(DOMNode **)(lVar4 + 8) = newChild;
                    if (newChild == (DOMNode *)0x0) {
                      plVar2 = (long *)0x0;
                    }
                    else {
                      plVar2 = (long *)__dynamic_cast(newChild,&DOMNode::typeinfo,
                                                      &HasDOMChildImpl::typeinfo,0xfffffffffffffffe)
                      ;
                    }
                    if (plVar2 != (long *)0x0) {
                      lVar4 = (**(code **)(*plVar2 + 0x10))(plVar2);
                      if (lVar4 != 0) {
                        plVar2 = (long *)(**(code **)(*plVar2 + 0x10))(plVar2);
                        *plVar2 = lVar3;
                        if (this->fFirstChild == (DOMNode *)0x0) {
                          plVar2 = (long *)0x0;
                        }
                        else {
                          plVar2 = (long *)__dynamic_cast(this->fFirstChild,&DOMNode::typeinfo,
                                                          &HasDOMChildImpl::typeinfo,
                                                          0xfffffffffffffffe);
                        }
                        if (plVar2 != (long *)0x0) {
                          lVar3 = (**(code **)(*plVar2 + 0x10))(plVar2);
                          if (lVar3 != 0) goto LAB_002809ad;
                        }
                        this_00 = (DOMException *)__cxa_allocate_exception(0x28);
                        DOMException::DOMException(this_00,0xb,0,XMLPlatformUtils::fgMemoryManager);
                        goto LAB_00280ae7;
                      }
                    }
                    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
                    DOMException::DOMException(this_00,0xb,0,XMLPlatformUtils::fgMemoryManager);
                    goto LAB_00280ae7;
                  }
                }
                this_00 = (DOMException *)__cxa_allocate_exception(0x28);
                DOMException::DOMException(this_00,0xb,0,XMLPlatformUtils::fgMemoryManager);
                goto LAB_00280ae7;
              }
            }
            this_00 = (DOMException *)__cxa_allocate_exception(0x28);
            DOMException::DOMException(this_00,0xb,0,XMLPlatformUtils::fgMemoryManager);
          }
          goto LAB_00280ae7;
        }
      }
      this_00 = (DOMException *)__cxa_allocate_exception(0x28);
      DOMException::DOMException(this_00,0xb,0,XMLPlatformUtils::fgMemoryManager);
      goto LAB_00280ae7;
    }
  }
  this_00 = (DOMException *)__cxa_allocate_exception(0x28);
  DOMException::DOMException(this_00,0xb,0,XMLPlatformUtils::fgMemoryManager);
LAB_00280ae7:
  __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

DOMNode * DOMParentNode::appendChildFast(DOMNode *newChild)
{
    // This function makes the following assumptions:
    //
    // - newChild != 0
    // - newChild is not read-only
    // - newChild is not a document fragment
    // - owner documents of this node and newChild are the same
    // - appending newChild to this node cannot result in a cycle
    // - DOMDocumentImpl::isKidOK (this, newChild) return true (that is,
    //   appending newChild to this node results in a valid structure)
    // - newChild->getParentNode() is 0
    // - there are no ranges set for this document
    //

    // Attach up
    castToNodeImpl(newChild)->fOwnerNode = getContainingNode();
    castToNodeImpl(newChild)->isOwned(true);

    // Attach before and after
    // Note: fFirstChild.previousSibling == lastChild!!
    if (fFirstChild != 0)
    {
        DOMNode *lastChild = castToChildImpl(fFirstChild)->previousSibling;
        castToChildImpl(lastChild)->nextSibling = newChild;
        castToChildImpl(newChild)->previousSibling = lastChild;
        castToChildImpl(fFirstChild)->previousSibling = newChild;
    }
    else
    {
        // this our first and only child
        fFirstChild = newChild;
        castToNodeImpl(newChild)->isFirstChild(true);
        // castToChildImpl(newChild)->previousSibling = newChild;
        DOMChildNode *newChild_ci = castToChildImpl(newChild);
        newChild_ci->previousSibling = newChild;
    }

    return newChild;
}